

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
          (ConfidentialTransactionContext *this,uint32_t version,uint32_t locktime)

{
  uint in_EDX;
  int in_ESI;
  ConfidentialTransaction *in_RDI;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(in_RDI,in_ESI,in_EDX);
  *(undefined ***)in_RDI = &PTR__ConfidentialTransactionContext_0057e558;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x406612);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
         *)0x40661f);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x40662f);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x40663f);
  return;
}

Assistant:

ConfidentialTransactionContext::ConfidentialTransactionContext(
    uint32_t version, uint32_t locktime)
    : ConfidentialTransaction(version, locktime) {}